

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O1

int duckdb_fmt::v6::internal::compare(bigint *lhs,bigint *rhs)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  int iVar9;
  long lVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  
  uVar5 = (lhs->bigits_).super_buffer<unsigned_int>.size_;
  iVar4 = (int)uVar5;
  iVar6 = lhs->exp_ + iVar4;
  iVar9 = (int)(rhs->bigits_).super_buffer<unsigned_int>.size_;
  iVar7 = rhs->exp_ + iVar9;
  bVar13 = SBORROW4(iVar6,iVar7);
  bVar12 = iVar6 - iVar7 < 0;
  bVar11 = iVar6 == iVar7;
  if (bVar11) {
    uVar3 = 0;
    if (0 < iVar4 - iVar9) {
      uVar3 = iVar4 - iVar9;
    }
    lVar8 = (long)iVar4;
    lVar10 = (long)iVar9;
    while ((long)(ulong)uVar3 < lVar8) {
      uVar2 = (lhs->bigits_).super_buffer<unsigned_int>.ptr_[lVar8 + -1];
      lVar8 = lVar8 + -1;
      uVar1 = (rhs->bigits_).super_buffer<unsigned_int>.ptr_[lVar10 + -1];
      uVar5 = uVar5 & 0xffffffff;
      if (uVar2 != uVar1) {
        uVar5 = (ulong)(((uVar1 < uVar2) - 1) + (uint)(uVar1 < uVar2));
      }
      lVar10 = lVar10 + -1;
      if (uVar2 != uVar1) {
        return (int)uVar5;
      }
    }
    bVar13 = SBORROW8(lVar8,lVar10);
    bVar12 = lVar8 - lVar10 < 0;
    bVar11 = lVar8 == lVar10;
    if (bVar11) {
      return 0;
    }
  }
  return (uint)(!bVar11 && bVar13 == bVar12) * 2 + -1;
}

Assistant:

std::size_t size() const FMT_NOEXCEPT { return size_; }